

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O2

size_t mtbdd_map_count(MTBDDMAP map)

{
  size_t r;
  size_t sVar1;
  
  sVar1 = 0;
  for (; map != 0; map = mtbdd_getlow(map)) {
    sVar1 = sVar1 + 1;
  }
  return sVar1;
}

Assistant:

size_t
mtbdd_map_count(MTBDDMAP map)
{
    size_t r = 0;

    while (!mtbdd_map_isempty(map)) {
        r++;
        map = mtbdd_map_next(map);
    }

    return r;
}